

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::deallocate_clause(Internal *this,Clause *c)

{
  bool bVar1;
  
  bVar1 = Arena::contains(&this->arena,c);
  if ((c != (Clause *)0x0) && (!bVar1)) {
    operator_delete__(c);
    return;
  }
  return;
}

Assistant:

void Internal::deallocate_clause (Clause *c) {
  char *p = (char *) c;
  if (arena.contains (p))
    return;
  LOG (c, "deallocate pointer %p", (void *) c);
  delete[] p;
}